

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneFormat::appendOffsetDigits
          (TimeZoneFormat *this,UnicodeString *buf,int32_t n,uint8_t minDigits)

{
  int iVar1;
  undefined3 in_register_00000009;
  int iVar2;
  bool bVar3;
  
  iVar1 = ~(uint)(9 < n) + CONCAT31(in_register_00000009,minDigits);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    UnicodeString::append(buf,this->fGMTOffsetDigits[0]);
  }
  if (9 < n) {
    UnicodeString::append(buf,this->fGMTOffsetDigits[(ulong)(uint)n / 10]);
  }
  UnicodeString::append(buf,this->fGMTOffsetDigits[n % 10]);
  return;
}

Assistant:

void
TimeZoneFormat::appendOffsetDigits(UnicodeString& buf, int32_t n, uint8_t minDigits) const {
    U_ASSERT(n >= 0 && n < 60);
    int32_t numDigits = n >= 10 ? 2 : 1;
    for (int32_t i = 0; i < minDigits - numDigits; i++) {
        buf.append(fGMTOffsetDigits[0]);
    }
    if (numDigits == 2) {
        buf.append(fGMTOffsetDigits[n / 10]);
    }
    buf.append(fGMTOffsetDigits[n % 10]);
}